

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.h
# Opt level: O3

bool __thiscall
llvm::cl::opt<bool,_false,_llvm::cl::parser<bool>_>::handleOccurrence
          (opt<bool,_false,_llvm::cl::parser<bool>_> *this,uint pos,StringRef ArgName,StringRef Arg)

{
  bool bVar1;
  parser_data_type Val;
  bool local_11;
  
  local_11 = false;
  bVar1 = parser<bool>::parse((parser<bool> *)this,&this->super_Option,ArgName,Arg,&local_11);
  if (!bVar1) {
    (this->super_opt_storage<bool,_false,_false>).Value = local_11;
    (this->super_Option).Position = pos;
  }
  return bVar1;
}

Assistant:

bool handleOccurrence(unsigned pos, StringRef ArgName,
                        StringRef Arg) override {
    typename ParserClass::parser_data_type Val =
        typename ParserClass::parser_data_type();
    if (Parser.parse(*this, ArgName, Arg, Val))
      return true; // Parse error!
    this->setValue(Val);
    this->setPosition(pos);
    return false;
  }